

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase435::run(TestCase435 *this)

{
  __pid_t _Var1;
  TransformPromiseNodeBase *pTVar2;
  Own<kj::_::ForkHub<int>_> local_c8;
  ForkedPromise<int> fork;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:447:40),_int>
  branch2;
  WaitScope waitScope;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:443:40),_int>
  branch1;
  Promise<int> promise;
  Own<kj::_::PromiseNode> local_68;
  undefined1 local_58 [16];
  EventLoop loop;
  
  EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  _::yield();
  pTVar2 = (TransformPromiseNodeBase *)operator_new(0x28);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar2,(Own<kj::_::PromiseNode> *)&fork,
             _::
             TransformPromiseNode<int,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:439:36),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  (pTVar2->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0041b150;
  local_c8.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,kj::_::Void,kj::(anonymous_namespace)::TestCase435::run()::$_0,kj::_::PropagateException>>
        ::instance;
  local_68.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,kj::_::Void,kj::(anonymous_namespace)::TestCase435::run()::$_0,kj::_::PropagateException>>
        ::instance;
  local_c8.ptr = (ForkHub<int> *)0x0;
  promise.super_PromiseBase.node.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,kj::_::Void,kj::(anonymous_namespace)::TestCase435::run()::$_0,kj::_::PropagateException>>
        ::instance;
  local_68.ptr = (PromiseNode *)0x0;
  promise.super_PromiseBase.node.ptr = (PromiseNode *)pTVar2;
  Own<kj::_::PromiseNode>::dispose(&local_68);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_c8);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&fork);
  Promise<int>::fork((Promise<int> *)&fork);
  _::ForkHub<int>::addBranch((ForkHub<int> *)&branch2);
  pTVar2 = (TransformPromiseNodeBase *)operator_new(0x28);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar2,(Own<kj::_::PromiseNode> *)&branch2,
             _::
             TransformPromiseNode<int,_int,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:443:40),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  (pTVar2->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0041b1d8;
  local_c8.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,int,kj::(anonymous_namespace)::TestCase435::run()::$_1,kj::_::PropagateException>>
        ::instance;
  local_68.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,int,kj::(anonymous_namespace)::TestCase435::run()::$_1,kj::_::PropagateException>>
        ::instance;
  local_c8.ptr = (ForkHub<int> *)0x0;
  branch1.super_PromiseBase.node.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,int,kj::(anonymous_namespace)::TestCase435::run()::$_1,kj::_::PropagateException>>
        ::instance;
  local_68.ptr = (PromiseNode *)0x0;
  branch1.super_PromiseBase.node.ptr = (PromiseNode *)pTVar2;
  Own<kj::_::PromiseNode>::dispose(&local_68);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_c8);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&branch2);
  _::ForkHub<int>::addBranch((ForkHub<int> *)local_58);
  pTVar2 = (TransformPromiseNodeBase *)operator_new(0x28);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar2,(Own<kj::_::PromiseNode> *)local_58,
             _::
             TransformPromiseNode<int,_int,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:447:40),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  (pTVar2->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0041b260;
  local_c8.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,int,kj::(anonymous_namespace)::TestCase435::run()::$_2,kj::_::PropagateException>>
        ::instance;
  local_68.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,int,kj::(anonymous_namespace)::TestCase435::run()::$_2,kj::_::PropagateException>>
        ::instance;
  local_c8.ptr = (ForkHub<int> *)0x0;
  branch2.super_PromiseBase.node.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,int,kj::(anonymous_namespace)::TestCase435::run()::$_2,kj::_::PropagateException>>
        ::instance;
  local_68.ptr = (PromiseNode *)0x0;
  branch2.super_PromiseBase.node.ptr = (PromiseNode *)pTVar2;
  Own<kj::_::PromiseNode>::dispose(&local_68);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_c8);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_58);
  local_c8.disposer = fork.hub.disposer;
  local_c8.ptr = fork.hub.ptr;
  fork.hub.ptr = (ForkHub<int> *)0x0;
  Own<kj::_::ForkHub<int>_>::dispose(&local_c8);
  _Var1 = Promise<int>::wait(&branch1,&waitScope);
  if ((_Var1 != 0x1c8) && (_::Debug::minSeverity < 3)) {
    local_c8.disposer = (Disposer *)CONCAT44(local_c8.disposer._4_4_,0x1c8);
    _Var1 = Promise<int>::wait(&branch1,&waitScope);
    local_68.disposer = (Disposer *)CONCAT44(local_68.disposer._4_4_,_Var1);
    _::Debug::log<char_const(&)[52],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x1c8,ERROR,
               "\"failed: expected \" \"(456) == (branch1.wait(waitScope))\", 456, branch1.wait(waitScope)"
               ,(char (*) [52])"failed: expected (456) == (branch1.wait(waitScope))",
               (int *)&local_c8,(int *)&local_68);
  }
  _Var1 = Promise<int>::wait(&branch2,&waitScope);
  if ((_Var1 != 0x315) && (_::Debug::minSeverity < 3)) {
    local_c8.disposer = (Disposer *)CONCAT44(local_c8.disposer._4_4_,0x315);
    _Var1 = Promise<int>::wait(&branch2,&waitScope);
    local_68.disposer = (Disposer *)CONCAT44(local_68.disposer._4_4_,_Var1);
    _::Debug::log<char_const(&)[52],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x1c9,ERROR,
               "\"failed: expected \" \"(789) == (branch2.wait(waitScope))\", 789, branch2.wait(waitScope)"
               ,(char (*) [52])"failed: expected (789) == (branch2.wait(waitScope))",
               (int *)&local_c8,(int *)&local_68);
  }
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&branch2);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&branch1);
  Own<kj::_::ForkHub<int>_>::dispose(&fork.hub);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&promise);
  WaitScope::~WaitScope(&waitScope);
  EventLoop::~EventLoop(&loop);
  return;
}

Assistant:

TEST(Async, Fork) {
  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<int> promise = evalLater([&]() { return 123; });

  auto fork = promise.fork();

  auto branch1 = fork.addBranch().then([](int i) {
    EXPECT_EQ(123, i);
    return 456;
  });
  auto branch2 = fork.addBranch().then([](int i) {
    EXPECT_EQ(123, i);
    return 789;
  });

  {
    auto releaseFork = kj::mv(fork);
  }

  EXPECT_EQ(456, branch1.wait(waitScope));
  EXPECT_EQ(789, branch2.wait(waitScope));
}